

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O0

Comparison __thiscall
DP::SimpleCongruenceClosure::ConstOrderingComparator::compare
          (ConstOrderingComparator *this,uint c1,uint c2)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  ConstInfo *pCVar5;
  uint in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  TermList c2NF;
  TermList c1NF;
  Comparison local_4;
  
  pCVar5 = Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::operator[]
                     ((DArray<DP::SimpleCongruenceClosure::ConstInfo> *)*in_RDI,(ulong)in_ESI);
  uVar1 = (pCVar5->normalForm)._content;
  pCVar5 = Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::operator[]
                     ((DArray<DP::SimpleCongruenceClosure::ConstInfo> *)*in_RDI,(ulong)in_EDX);
  uVar2 = (pCVar5->normalForm)._content;
  bVar3 = Kernel::TermList::isEmpty((TermList *)0x2a6e71);
  if (bVar3) {
    bVar3 = Kernel::TermList::isEmpty((TermList *)0x2a6e81);
    if (bVar3) {
      local_4 = EQUAL;
    }
    else {
      local_4 = LESS;
    }
  }
  else {
    bVar3 = Kernel::TermList::isEmpty((TermList *)0x2a6eab);
    if (bVar3) {
      local_4 = GREATER;
    }
    else {
      Kernel::TermList::term((TermList *)0x2a6ec8);
      bVar3 = Kernel::Term::isSort((Term *)0x2a6ed0);
      if (bVar3) {
        Kernel::TermList::term((TermList *)0x2a6ee0);
        bVar3 = Kernel::Term::isSort((Term *)0x2a6ee8);
        if (!bVar3) {
          return LESS;
        }
      }
      Kernel::TermList::term((TermList *)0x2a6f03);
      bVar3 = Kernel::Term::isSort((Term *)0x2a6f0b);
      if (bVar3) {
        Kernel::TermList::term((TermList *)0x2a6f1b);
        bVar3 = Kernel::Term::isSort((Term *)0x2a6f23);
        if (!bVar3) {
          return GREATER;
        }
      }
      iVar4 = (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],uVar1,uVar2);
      if (iVar4 == 1) {
        local_4 = GREATER;
      }
      else if (iVar4 == 2) {
        local_4 = LESS;
      }
      else {
        local_4 = EQUAL;
      }
    }
  }
  return local_4;
}

Assistant:

Comparison compare(unsigned c1, unsigned c2)
  {
    TermList c1NF = _cInfos[c1].normalForm;
    TermList c2NF = _cInfos[c2].normalForm;
    
    // we don't care about the order of partial applications 
    // as long as they are smaller than the proper terms
    
    if (c1NF.isEmpty()) {
      if (c2NF.isEmpty()) {
        return EQUAL;
      } else {
        return LESS;
      }
    } else {
      if (c2NF.isEmpty()) {
        return GREATER;
      } else {
        // We should not be comparing sorts with terms via the ordering
        if(c1NF.term()->isSort() && !c2NF.term()->isSort()){
          return LESS;
        } else if(c2NF.term()->isSort() && !c1NF.term()->isSort()) {
          return GREATER;
        }
        // two proper terms
        switch(_ord.compare(c1NF,c2NF)) {
          case Ordering::Result::GREATER:
            return GREATER;    
          case Ordering::Result::LESS:
            return LESS;
          case Ordering::Result::EQUAL:
            return EQUAL;    
          default:
            ASSERTION_VIOLATION;
        }
      }
    }
  }